

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshLodInfo(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  uint32_t uVar2;
  DeadlyImportError *pDVar3;
  int iVar4;
  uint32_t len;
  bool is32bit;
  uint32_t indexCount;
  ulong local_e0;
  size_t silen;
  size_t si;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  uint16_t local_4a;
  ulong uStack_48;
  uint16_t id;
  size_t i;
  undefined1 local_38 [5];
  bool manual;
  uint16_t numLods;
  Mesh *local_18;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  ReadLine_abi_cxx11_((string *)local_38,this);
  std::__cxx11::string::~string((string *)local_38);
  i._6_2_ = Read<unsigned_short>(this);
  i._5_1_ = Read<bool>(this);
  uStack_48 = 1;
  while( true ) {
    if (i._6_2_ <= uStack_48) {
      return;
    }
    local_4a = ReadHeader(this,true);
    if (local_4a != 0x8100) break;
    StreamReader<false,_false>::IncPtr(this->m_reader,4);
    if ((i._5_1_ & 1) == 0) {
      silen = 0;
      local_e0 = Ogre::Mesh::NumSubMeshes(local_18);
      for (; silen < local_e0; silen = silen + 1) {
        local_4a = ReadHeader(this,true);
        if (local_4a != 0x8120) {
          pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&indexCount,
                     "Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED",
                     (allocator<char> *)&is32bit);
          DeadlyImportError::DeadlyImportError(pDVar3,(string *)&indexCount);
          __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        uVar2 = Read<unsigned_int>(this);
        bVar1 = Read<bool>(this);
        if (uVar2 != 0) {
          iVar4 = 2;
          if (bVar1) {
            iVar4 = 4;
          }
          StreamReader<false,_false>::IncPtr(this->m_reader,(ulong)(uVar2 * iVar4));
        }
      }
    }
    else {
      local_4a = ReadHeader(this,true);
      if (local_4a != 0x8110) {
        local_aa = 1;
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL",
                   &local_a9);
        DeadlyImportError::DeadlyImportError(pDVar3,&local_a8);
        local_aa = 0;
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ReadLine_abi_cxx11_((string *)&si,this);
      std::__cxx11::string::~string((string *)&si);
    }
    uStack_48 = uStack_48 + 1;
  }
  local_85 = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level"
             ,&local_71);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_70);
  local_85 = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreBinarySerializer::ReadMeshLodInfo(Mesh *mesh)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.
    // @todo Put this stuff to scene/mesh custom properties. If manual mesh the app can use the information.
    ReadLine(); // strategy name
    uint16_t numLods = Read<uint16_t>();
    bool manual = Read<bool>();

    /// @note Main mesh is considered as LOD 0, start from index 1.
    for (size_t i=1; i<numLods; ++i)
    {
        uint16_t id = ReadHeader();
        if (id != M_MESH_LOD_USAGE) {
            throw DeadlyImportError("M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level");
        }

        m_reader->IncPtr(sizeof(float)); // user value

        if (manual)
        {
            id = ReadHeader();
            if (id != M_MESH_LOD_MANUAL) {
                throw DeadlyImportError("Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL");
            }

            ReadLine(); // manual mesh name (ref to another mesh)
        }
        else
        {
            for(size_t si=0, silen=mesh->NumSubMeshes(); si<silen; ++si)
            {
                id = ReadHeader();
                if (id != M_MESH_LOD_GENERATED) {
                    throw DeadlyImportError("Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED");
                }

                uint32_t indexCount = Read<uint32_t>();
                bool is32bit = Read<bool>();

                if (indexCount > 0)
                {
                    uint32_t len = indexCount * (is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
                    m_reader->IncPtr(len);
                }
            }
        }
    }
}